

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O3

void __thiscall flow::lang::ASTPrinter::print(ASTPrinter *this,char *title,ASTNode *node)

{
  int iVar1;
  
  this->depth_ = this->depth_ + 1;
  if (node == (ASTNode *)0x0) {
    printf<char_const*>(this,"%s (nil)\n",title);
    iVar1 = this->depth_;
  }
  else {
    printf<char_const*>(this,"%s\n",title);
    this->depth_ = this->depth_ + 1;
    (*node->_vptr_ASTNode[2])(node,this);
    iVar1 = this->depth_ + -1;
  }
  this->depth_ = iVar1 + -1;
  return;
}

Assistant:

void ASTPrinter::print(const char* title, ASTNode* node) {
  enter();
  if (node) {
    printf("%s\n", title);
    enter();
    node->visit(*this);
    leave();
  } else {
    printf("%s (nil)\n", title);
  }
  leave();
}